

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.c
# Opt level: O0

void pre_auth_append(pre_auth *pa,uint8_t *data,size_t len)

{
  uint8_t *puVar1;
  size_t len_local;
  uint8_t *data_local;
  pre_auth *pa_local;
  
  puVar1 = le64(pa->current,len);
  pa->current = puVar1;
  if (len != 0) {
    memcpy(pa->current,data,len);
  }
  pa->current = pa->current + len;
  return;
}

Assistant:

void pre_auth_append(struct pre_auth *pa, const uint8_t *data, size_t len) {
    pa->current = le64(pa->current, len);
    if (len > 0) memcpy(pa->current, data, len);
    pa->current += len;
}